

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldisc.c
# Opt level: O0

void ldisc_check_sendok_callback(void *ctx)

{
  undefined8 uVar1;
  SessionSpecialCode code;
  _Bool _Var2;
  size_t sVar3;
  LdiscInputToken LVar4;
  undefined8 local_50;
  wchar_t local_48;
  undefined8 local_3c;
  LdiscInputToken tok;
  char *ff;
  ptrlen data;
  Ldisc *ldisc;
  void *ctx_local;
  
  if ((*(long *)((long)ctx + 8) != 0) &&
     (_Var2 = backend_sendok(*(Backend **)((long)ctx + 8)), _Var2)) {
    while (sVar3 = bufchain_size((bufchain *)((long)ctx + 0x18)), sVar3 != 0) {
      _ff = bufchain_prefix((bufchain *)((long)ctx + 0x18));
      tok.field_1 = (anon_union_8_2_ecfd7102_for_LdiscInputToken_1)memchr(ff,-1,(size_t)data.ptr);
      if (tok.field_1 == (anon_union_8_2_ecfd7102_for_LdiscInputToken_1)ff) {
        LVar4 = ldisc_get_input_token((Ldisc *)ctx);
        local_50 = LVar4._0_8_;
        local_3c = local_50;
        uVar1 = local_3c;
        local_48 = LVar4.field_1._4_4_;
        tok._0_4_ = local_48;
        if (((undefined1  [12])LVar4 & (undefined1  [12])0x1) == (undefined1  [12])0x0) {
          backend_send(*(Backend **)((long)ctx + 8),(char *)((long)&local_3c + 4),1);
        }
        else {
          local_3c._4_4_ = LVar4.field_1._0_4_;
          code = local_3c._4_4_;
          local_3c = uVar1;
          backend_special(*(Backend **)((long)ctx + 8),code,local_48);
        }
      }
      else {
        if (tok.field_1 != (anon_union_8_2_ecfd7102_for_LdiscInputToken_1)0x0) {
          data.ptr = (void *)((long)tok.field_1 - (long)ff);
        }
        backend_send(*(Backend **)((long)ctx + 8),ff,(size_t)data.ptr);
        bufchain_consume((bufchain *)((long)ctx + 0x18),(size_t)data.ptr);
      }
    }
  }
  return;
}

Assistant:

static void ldisc_check_sendok_callback(void *ctx)
{
    Ldisc *ldisc = (Ldisc *)ctx;

    if (!(ldisc->backend && backend_sendok(ldisc->backend)))
        return;

    /*
     * Flush the ldisc input queue into the backend, which is now
     * willing to receive the data.
     */
    while (bufchain_size(&ldisc->input_queue) > 0) {
        /*
         * Process either a chunk of non-special data, or an FF
         * escape, depending on whether the first thing we see is an
         * FF byte.
         */
        ptrlen data = bufchain_prefix(&ldisc->input_queue);
        const char *ff = memchr(data.ptr, '\xFF', data.len);
        if (ff != data.ptr) {
            /* Send a maximal block of data not containing any
             * difficult bytes. */
            if (ff)
                data.len = ff - (const char *)data.ptr;
            backend_send(ldisc->backend, data.ptr, data.len);
            bufchain_consume(&ldisc->input_queue, data.len);
        } else {
            /* Decode either a special or an escaped FF byte. The
             * easiest way to do this is to reuse the decoding code
             * already in ldisc_get_input_token. */
            LdiscInputToken tok = ldisc_get_input_token(ldisc);
            if (tok.is_special)
                backend_special(ldisc->backend, tok.code, tok.arg);
            else
                backend_send(ldisc->backend, &tok.chr, 1);
        }
    }
}